

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

N_Vector * N_VCloneEmptyVectorArray(int count,N_Vector w)

{
  N_Vector p_Var1;
  int in_EDI;
  int j;
  N_Vector *vs;
  int count_00;
  N_Vector local_8;
  
  if (in_EDI < 1) {
    local_8 = (N_Vector)0x0;
  }
  else {
    local_8 = (N_Vector)malloc((long)in_EDI << 3);
    if (local_8 == (N_Vector)0x0) {
      local_8 = (N_Vector)0x0;
    }
    else {
      for (count_00 = 0; count_00 < in_EDI; count_00 = count_00 + 1) {
        p_Var1 = N_VCloneEmpty(local_8);
        (&local_8->content)[count_00] = p_Var1;
        if ((&local_8->content)[count_00] == (void *)0x0) {
          N_VDestroyVectorArray((N_Vector *)local_8,count_00);
          return (N_Vector *)0x0;
        }
      }
    }
  }
  return (N_Vector *)local_8;
}

Assistant:

N_Vector* N_VCloneEmptyVectorArray(int count, N_Vector w)
{
  N_Vector* vs = NULL;
  int j;

  if (count <= 0) return(NULL);

  vs = (N_Vector* ) malloc(count * sizeof(N_Vector));
  if(vs == NULL) return(NULL);

  for (j = 0; j < count; j++) {
    vs[j] = N_VCloneEmpty(w);
    if (vs[j] == NULL) {
      N_VDestroyVectorArray(vs, j-1);
      return(NULL);
    }
  }

  return(vs);
}